

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

bool __thiscall
math::wide_integer::uintwide_t<32768u,unsigned_int,void,false>::wr_string<char*>
          (uintwide_t<32768u,unsigned_int,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  unsigned_fast_type i;
  void *__s;
  long lVar4;
  unsigned_fast_type uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  uintwide_t<24U,_unsigned_char,_void,_false> t_1;
  uintwide_t<24U,_unsigned_char,_void,_false> tmp;
  uint local_4030 [3072];
  undefined1 local_1030 [4096];
  
  iVar9 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar9 != 0x10) {
    if (iVar9 != 10) {
      if (iVar9 != 8) {
        return false;
      }
      memcpy(local_4030,this,0x1000);
      __s = operator_new(0x2ab3);
      memset(__s,0,0x2ab3);
      if (local_4030[0] == 0) {
        lVar4 = 4;
        do {
          lVar8 = lVar4;
          if (lVar8 == 0x1000) goto LAB_0015c074;
          lVar4 = lVar8 + 4;
        } while (*(int *)((long)local_4030 + lVar8) == 0);
        if (lVar8 == 0x1000) {
LAB_0015c074:
          *(undefined1 *)((long)__s + 0x2ab1) = 0x30;
          uVar6 = 0x2ab1;
LAB_0015c084:
          if (show_base && 0 < (long)uVar6) {
            uVar6 = uVar6 - 1;
            *(undefined1 *)((long)__s + (uVar6 & 0xffffffff)) = 0x30;
          }
          if (show_pos && 0 < (long)uVar6) {
            uVar6 = uVar6 - 1;
            *(undefined1 *)((long)__s + (uVar6 & 0xffffffff)) = 0x2b;
          }
          if (field_width != 0) {
            lVar4 = 0;
            if (field_width < 0x2ab3) {
              lVar4 = 0x2ab2 - field_width;
            }
            while (lVar4 < (long)uVar6) {
              uVar6 = uVar6 - 1;
              *(char *)((long)__s + (uVar6 & 0xffffffff)) = fill_char_str;
            }
          }
          *(undefined1 *)((long)__s + 0x2ab2) = 0;
          lVar4 = 0;
          do {
            cVar2 = *(char *)((long)__s + lVar4 + uVar6);
            str_result[lVar4] = cVar2;
            lVar4 = lVar4 + 1;
          } while (cVar2 != '\0');
          uVar6 = 0x2ab3;
          goto LAB_0015c0fc;
        }
      }
      uVar6 = 0x2ab2;
      do {
        if (local_4030[0] == 0) {
          lVar4 = 4;
          do {
            bVar12 = lVar4 == 0x1000;
            if (bVar12) break;
            piVar1 = (int *)((long)local_4030 + lVar4);
            lVar4 = lVar4 + 4;
          } while (*piVar1 == 0);
        }
        else {
          bVar12 = false;
        }
        uVar7 = uVar6 - 1;
        if ((uVar6 == 0) || (bVar12)) goto LAB_0015c084;
        *(byte *)((long)__s + (uVar7 & 0xffffffff)) = (byte)local_4030[0] & 7 | 0x30;
        uVar11 = 0;
        lVar4 = 0xffc;
        do {
          uVar3 = *(uint *)((long)local_4030 + lVar4);
          *(uint *)((long)local_4030 + lVar4) = uVar3 >> 3 | uVar11;
          uVar11 = uVar3 << 0x1d;
          lVar4 = lVar4 + -4;
          uVar6 = uVar7;
        } while (lVar4 != -4);
      } while( true );
    }
    memcpy(local_4030 + 0x400,this,0x1000);
    __s = operator_new(0x2691);
    memset(__s,0,0x2691);
    if (local_4030[0x400] != 0) {
LAB_0015bd1c:
      uVar6 = 0x2690;
      do {
        if (local_4030[0x400] == 0) {
          lVar4 = 4;
          do {
            bVar12 = lVar4 == 0x1000;
            if (bVar12) break;
            lVar8 = lVar4 + 0x1000;
            lVar4 = lVar4 + 4;
          } while (*(int *)((long)local_4030 + lVar8) == 0);
        }
        else {
          bVar12 = false;
        }
        if ((uVar6 == 0) || (bVar12)) goto LAB_0015bf09;
        memcpy(local_1030,local_4030 + 0x400,0x1000);
        lVar4 = 0xffc;
        uVar10 = 0;
        uVar7 = 0;
        do {
          uVar7 = CONCAT44((int)uVar7 + (int)uVar10 * -10,
                           *(undefined4 *)((long)local_4030 + lVar4 + 0x1000));
          uVar10 = uVar7 / 10;
          *(int *)((long)local_4030 + lVar4 + 0x1000) = (int)uVar10;
          lVar4 = lVar4 + -4;
        } while (lVar4 != -4);
        memcpy(local_4030 + 0x800,local_4030 + 0x400,0x1000);
        lVar4 = 0;
        uVar7 = 0;
        do {
          uVar7 = uVar7 + (ulong)local_4030[lVar4 + 0x800] * 10;
          local_4030[lVar4 + 0x800] = (uint)uVar7;
          uVar7 = uVar7 >> 0x20;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x400);
        memcpy(local_4030,local_1030,0x1000);
        lVar4 = 0;
        bVar12 = false;
        do {
          uVar7 = ((ulong)local_4030[lVar4] - (ulong)bVar12) - (ulong)local_4030[lVar4 + 0x800];
          local_4030[lVar4] = (uint)uVar7;
          bVar12 = uVar7 >> 0x20 != 0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x400);
        *(byte *)((long)__s + (uVar6 - 1 & 0xffffffff)) = (byte)local_4030[0] + '0';
        uVar6 = uVar6 - 1;
      } while( true );
    }
    lVar4 = 4;
    do {
      lVar8 = lVar4;
      if (lVar8 == 0x1000) goto LAB_0015befc;
      lVar4 = lVar8 + 4;
    } while (*(int *)((long)local_4030 + lVar8 + 0x1000) == 0);
    if (lVar8 != 0x1000) goto LAB_0015bd1c;
LAB_0015befc:
    *(undefined1 *)((long)__s + 0x268f) = 0x30;
    uVar6 = 0x268f;
LAB_0015bf09:
    if (show_pos && 0 < (long)uVar6) {
      uVar6 = uVar6 - 1;
      *(undefined1 *)((long)__s + (uVar6 & 0xffffffff)) = 0x2b;
    }
    if (field_width != 0) {
      lVar4 = 0;
      if (field_width < 0x2691) {
        lVar4 = 0x2690 - field_width;
      }
      while (lVar4 < (long)uVar6) {
        uVar6 = uVar6 - 1;
        *(char *)((long)__s + (uVar6 & 0xffffffff)) = fill_char_str;
      }
    }
    *(undefined1 *)((long)__s + 0x2690) = 0;
    lVar4 = 0;
    do {
      cVar2 = *(char *)((long)__s + lVar4 + uVar6);
      str_result[lVar4] = cVar2;
      lVar4 = lVar4 + 1;
    } while (cVar2 != '\0');
    uVar6 = 0x2691;
    goto LAB_0015c0fc;
  }
  memcpy(local_4030,this,0x1000);
  __s = operator_new(0x2008);
  memset(__s,0,0x2008);
  if (local_4030[0] == 0) {
    lVar4 = 4;
    do {
      lVar8 = lVar4;
      if (lVar8 == 0x1000) goto LAB_0015bfa7;
      lVar4 = lVar8 + 4;
    } while (*(int *)((long)local_4030 + lVar8) == 0);
    if (lVar8 != 0x1000) goto LAB_0015bea7;
LAB_0015bfa7:
    *(undefined1 *)((long)__s + 0x2006) = 0x30;
    uVar6 = 0x2006;
  }
  else {
LAB_0015bea7:
    uVar5 = uintwide_t<32768U,_unsigned_int,_void,_false>::extract_hex_digits<false,_nullptr>
                      ((uintwide_t<24U,_unsigned_char,_void,_false> *)local_4030,
                       (char *)((long)__s + 0x2007),is_uppercase);
    uVar6 = 0x2007 - uVar5;
  }
  if ((show_base) && (1 < (long)uVar6)) {
    *(byte *)((long)__s + (ulong)((int)uVar6 - 1)) = !is_uppercase << 5 | 0x58;
    uVar6 = uVar6 - 2;
    *(undefined1 *)((long)__s + (uVar6 & 0xffffffff)) = 0x30;
  }
  if ((show_pos) && (0 < (long)uVar6)) {
    uVar6 = uVar6 - 1;
    *(undefined1 *)((long)__s + (uVar6 & 0xffffffff)) = 0x2b;
  }
  if (field_width != 0) {
    lVar4 = 0;
    if (field_width < 0x2008) {
      lVar4 = 0x2007 - field_width;
    }
    while (lVar4 < (long)uVar6) {
      uVar6 = uVar6 - 1;
      *(char *)((long)__s + (uVar6 & 0xffffffff)) = fill_char_str;
    }
  }
  *(undefined1 *)((long)__s + 0x2007) = 0;
  lVar4 = 0;
  do {
    cVar2 = *(char *)((long)__s + lVar4 + uVar6);
    str_result[lVar4] = cVar2;
    lVar4 = lVar4 + 1;
  } while (cVar2 != '\0');
  uVar6 = 0x2008;
LAB_0015c0fc:
  operator_delete(__s,uVar6);
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }